

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaKf.c
# Opt level: O1

void Kf_SetMergePairs(Kf_Set_t *p,Kf_Cut_t *pCut0,Kf_Cut_t *pCuts,int nCuts,int fArea)

{
  ushort uVar1;
  int iVar2;
  uint uVar3;
  Kf_Cut_t *pKVar4;
  ulong uVar5;
  long lVar6;
  int iVar7;
  uint uVar8;
  Kf_Cut_t *pKVar9;
  
  Kf_HashPopulate(p,pCut0);
  if (0 < nCuts) {
    pKVar4 = pCuts + nCuts;
    uVar1 = p->nLutSize;
    do {
      iVar2 = pCut0->nLeaves;
      if ((pCuts->nLeaves + iVar2 <= (int)(uint)uVar1) ||
         (uVar5 = pCuts->Sign | pCut0->Sign, uVar5 = uVar5 - (uVar5 >> 1 & 0x5555555555555555),
         uVar5 = (uVar5 >> 2 & 0x3333333333333333) + (uVar5 & 0x3333333333333333),
         (uint)(byte)(((uVar5 >> 4) + uVar5 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >> 0x38) <=
         (uint)uVar1)) {
        if (iVar2 < p->nTEntries) {
          lVar6 = (long)iVar2;
          do {
            p->pTable[p->pPlace[lVar6]] = 0;
            lVar6 = lVar6 + 1;
          } while (lVar6 < p->nTEntries);
        }
        p->nTEntries = iVar2;
        if (pCuts->nLeaves < 1) {
          lVar6 = 0;
        }
        else {
          lVar6 = 0;
          do {
            uVar3 = pCuts->pLeaves[lVar6];
            if ((int)uVar3 < 1) {
LAB_007624fd:
              __assert_fail("i > 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaKf.c"
                            ,0x179,"int Kf_HashLookup(Kf_Set_t *, int)");
            }
            uVar8 = uVar3;
            while( true ) {
              uVar8 = p->TableMask & uVar8;
              uVar5 = (ulong)uVar8;
              if (p->pTable[uVar5] == 0) break;
              if (p->pTable[uVar5] == uVar3) {
                uVar5 = 0xffffffff;
                break;
              }
              uVar8 = uVar8 + 1;
            }
            if ((int)uVar5 != -1) {
              uVar8 = p->nTEntries;
              if (uVar8 == uVar1) break;
              if (p->pTable[uVar5] != 0) {
                __assert_fail("p->pTable[k] == 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaKf.c"
                              ,0x186,"int Kf_HashFindOrAdd(Kf_Set_t *, int)");
              }
              p->pTable[uVar5] = uVar3;
              p->pPlace[(int)uVar8] = (int)uVar5;
              iVar2 = p->nTEntries;
              p->nTEntries = iVar2 + 1;
              p->pValue[uVar5] = iVar2;
            }
            lVar6 = lVar6 + 1;
          } while (lVar6 < pCuts->nLeaves);
        }
        if (pCuts->nLeaves <= (int)lVar6) {
          p->CutCount[1] = p->CutCount[1] + 1;
          uVar5 = pCuts->Sign | pCut0->Sign;
          iVar2 = p->pList[p->nTEntries];
          while (-1 < (long)iVar2) {
            pKVar9 = p->pCutsR + iVar2;
            if (pKVar9->Sign == uVar5) {
              if (0 < (long)pKVar9->nLeaves) {
                lVar6 = 0;
                do {
                  uVar3 = pKVar9->pLeaves[lVar6];
                  if ((int)uVar3 < 1) goto LAB_007624fd;
                  uVar8 = uVar3;
                  while( true ) {
                    uVar8 = p->TableMask & uVar8;
                    if (p->pTable[uVar8] == 0) break;
                    if (p->pTable[uVar8] == uVar3) {
                      uVar8 = 0xffffffff;
                      break;
                    }
                    uVar8 = uVar8 + 1;
                  }
                  if (-1 < (int)uVar8) goto LAB_00762415;
                  lVar6 = lVar6 + 1;
                  if (lVar6 == pKVar9->nLeaves) break;
                } while( true );
              }
              goto LAB_007624b6;
            }
LAB_00762415:
            iVar2 = pKVar9->iNext;
          }
          iVar2 = p->nCuts;
          p->nCuts = iVar2 + 1;
          pKVar9 = p->pCutsR + iVar2;
          p->pCutsR[iVar2].nLeaves = p->nTEntries;
          if (0 < p->nTEntries) {
            lVar6 = 0;
            do {
              pKVar9->pLeaves[lVar6] = p->pTable[p->pPlace[lVar6]];
              lVar6 = lVar6 + 1;
            } while (lVar6 < p->nTEntries);
          }
          pKVar9->Sign = uVar5;
          iVar7 = pCuts->Delay;
          if (pCuts->Delay < pCut0->Delay) {
            iVar7 = pCut0->Delay;
          }
          pKVar9->Delay = iVar7;
          pKVar9->Area = pCut0->Area + pCuts->Area;
          pKVar9->iNext = p->pList[pKVar9->nLeaves];
          p->pList[pKVar9->nLeaves] = iVar2;
        }
      }
LAB_007624b6:
      pCuts = pCuts + 1;
    } while (pCuts < pKVar4);
  }
  if (0 < p->nTEntries) {
    lVar6 = 0;
    do {
      p->pTable[p->pPlace[lVar6]] = 0;
      lVar6 = lVar6 + 1;
    } while (lVar6 < p->nTEntries);
  }
  p->nTEntries = 0;
  return;
}

Assistant:

static inline void Kf_SetMergePairs( Kf_Set_t * p, Kf_Cut_t * pCut0, Kf_Cut_t * pCuts, int nCuts, int fArea )
{
    Kf_Cut_t * pCut1, * pCutR;  int i;
    Kf_HashPopulate( p, pCut0 );
    for ( pCut1 = pCuts; pCut1 < pCuts + nCuts; pCut1++ )
    {
        if ( pCut0->nLeaves + pCut1->nLeaves > p->nLutSize && Kf_SetCountBits(pCut0->Sign | pCut1->Sign) > p->nLutSize )
            continue;
        Kf_HashCleanup( p, pCut0->nLeaves );
        for ( i = 0; i < pCut1->nLeaves; i++ )
            if ( Kf_HashFindOrAdd(p, pCut1->pLeaves[i]) )
                break;
        if ( i < pCut1->nLeaves )
            continue;
        p->CutCount[1]++;        
        if ( Kf_SetRemoveDuplicates(p, p->nTEntries, pCut0->Sign | pCut1->Sign) )
            continue;
        // create new cut
        pCutR = p->pCutsR + p->nCuts++;
        pCutR->nLeaves = p->nTEntries;
        for ( i = 0; i < p->nTEntries; i++ )
            pCutR->pLeaves[i] = p->pTable[p->pPlace[i]];
        pCutR->Sign  = pCut0->Sign | pCut1->Sign;
        pCutR->Delay = Abc_MaxInt(pCut0->Delay, pCut1->Delay);
        pCutR->Area  = pCut0->Area + pCut1->Area;
        // add new cut
        Kf_SetAddToList( p, pCutR, 0 );
    }
    Kf_HashCleanup( p, 0 );
}